

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

void __thiscall
r_exec::IPGMContext::addReference
          (IPGMContext *this,View *destination,uint16_t write_index,Code *referenced_object)

{
  undefined2 in_register_00000012;
  Atom local_1c [4];
  
  (destination->super_View).references[(destination->super_View).references[0] != (Code *)0x0] =
       referenced_object;
  r_code::Atom::RPointer((ushort)local_1c);
  r_code::Atom::operator=
            ((Atom *)((long)(destination->super_View).references +
                     (ulong)CONCAT22(in_register_00000012,write_index) * 4 + 0x18),local_1c);
  r_code::Atom::~Atom(local_1c);
  return;
}

Assistant:

void addReference(View *destination, uint16_t write_index, Code *referenced_object) const   // view references are set in order (index 0 then 1).
    {
        uint16_t r_ptr_index;

        if (destination->references[0]) { // first ref already in place.
            r_ptr_index = 1;
        } else {
            r_ptr_index = 0;
        }

        destination->references[r_ptr_index] = referenced_object;
        destination->code(write_index) = Atom::RPointer(r_ptr_index);
    }